

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall
QDockWidgetPrivate::nonClientAreaMouseEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  QWidgetData *pQVar5;
  DragState *pDVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  QStyle *pQVar10;
  QWidget *this_01;
  QMainWindow *pQVar11;
  QDockWidgetGroupWindow *pQVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  QPointF local_60;
  QPoint local_50;
  QPoint local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar10 = QWidget::style(this_00);
  iVar9 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x12,0,this_00);
  this_01 = QWidget::window(this_00);
  pQVar5 = this_01->data;
  iVar2 = (pQVar5->crect).x1.m_i;
  iVar3 = (pQVar5->crect).y1.m_i;
  iVar4 = (pQVar5->crect).x2.m_i;
  QVar13 = QWidget::frameGeometry(this_01);
  local_3c = iVar3 + -1;
  local_48.yp.m_i = QVar13.y1.m_i.m_i + iVar9;
  sVar1 = *(short *)(event + 8);
  local_48.xp.m_i = iVar2;
  local_40 = iVar4;
  if (sVar1 == 0xad) {
    pDVar6 = this->state;
    if (((pDVar6 != (DragState *)0x0) && (pDVar6->dragging == true)) && (pDVar6->nca == true)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        endDrag(this,LocationChange);
        return;
      }
      goto LAB_003d6d27;
    }
  }
  else {
    if (sVar1 == 0xb0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        toggleTopLevel(this);
        return;
      }
      goto LAB_003d6d27;
    }
    if (sVar1 == 0xae) {
      local_60 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      local_50 = QPointF::toPoint(&local_60);
      cVar7 = QRect::contains(&local_48,SUB81(&local_50,0));
      if ((cVar7 != '\0') && (this->state == (DragState *)0x0)) {
        pQVar11 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                            (*(QObject **)&(this->super_QWidgetPrivate).field_0x10);
        if (pQVar11 == (QMainWindow *)0x0) {
          pQVar12 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                              (*(QObject **)&(this->super_QWidgetPrivate).field_0x10);
          if (pQVar12 == (QDockWidgetGroupWindow *)0x0) goto LAB_003d6d08;
        }
        bVar8 = isAnimating(this);
        if (!bVar8) {
          local_60 = QSinglePointEvent::position((QSinglePointEvent *)event);
          local_50 = QPointF::toPoint(&local_60);
          initDrag(this,&local_50,true);
          if (this->state != (DragState *)0x0) {
            bVar8 = true;
            if (((byte)event[0x23] & 4) == 0) {
              if (((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                   super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 2) == 0) {
                bVar8 = (bool)((byte)(this_00->data->window_flags).
                                     super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                     super_QFlagsStorage<Qt::WindowType>.i & 1);
              }
              else {
                bVar8 = false;
              }
            }
            this->state->ctrlDrag = bVar8;
            startDrag(this,Group);
          }
        }
      }
    }
  }
LAB_003d6d08:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003d6d27:
  __stack_chk_fail();
}

Assistant:

void QDockWidgetPrivate::nonClientAreaMouseEvent(QMouseEvent *event)
{
    Q_Q(QDockWidget);

    int fw = q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q);

    QWidget *tl = q->topLevelWidget();
    QRect geo = tl->geometry();
    QRect titleRect = tl->frameGeometry();
    {
        titleRect.setLeft(geo.left());
        titleRect.setRight(geo.right());
        titleRect.setBottom(geo.top() - 1);
        titleRect.adjust(0, fw, 0, 0);
    }

    switch (event->type()) {
        case QEvent::NonClientAreaMouseButtonPress:
            if (!titleRect.contains(event->globalPosition().toPoint()))
                break;
            if (state != nullptr)
                break;
            if (qobject_cast<QMainWindow*>(parent) == nullptr && qobject_cast<QDockWidgetGroupWindow*>(parent) == nullptr)
                break;
            if (isAnimating())
                break;
            initDrag(event->position().toPoint(), true);
            if (state == nullptr)
                break;
            state->ctrlDrag = (event->modifiers() & Qt::ControlModifier) ||
                              (!hasFeature(this, QDockWidget::DockWidgetMovable) && q->isFloating());
            startDrag(DragScope::Group);
            break;
        case QEvent::NonClientAreaMouseMove:
            if (state == nullptr || !state->dragging)
                break;

#if !defined(Q_OS_MAC) && !defined(Q_OS_WASM)
            if (state->nca)
                endDrag(EndDragMode::LocationChange);
#endif
            break;
        case QEvent::NonClientAreaMouseButtonRelease:
#if defined(Q_OS_MAC) || defined(Q_OS_WASM)
                        if (state)
                            endDrag(EndDragMode::LocationChange);
#endif
                        break;
        case QEvent::NonClientAreaMouseButtonDblClick:
            toggleTopLevel();
            break;
        default:
            break;
    }
}